

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O3

void __thiscall
UtestShell::assertBinaryEqual
          (UtestShell *this,void *expected,void *actual,size_t length,char *text,char *fileName,
          size_t lineNumber,TestTerminator *testTerminator)

{
  int iVar1;
  undefined4 extraout_var;
  SimpleString SStack_a8;
  TestFailure local_98;
  TestResult *pTVar2;
  
  pTVar2 = testResult_;
  if (testResult_ == (TestResult *)0x0) {
    OutsideTestRunnerUTest::instance();
    iVar1 = (*OutsideTestRunnerUTest::instance::instance_.super_UtestShell._vptr_UtestShell[0x29])
                      (&OutsideTestRunnerUTest::instance::instance_);
    pTVar2 = (TestResult *)CONCAT44(extraout_var,iVar1);
  }
  (*pTVar2->_vptr_TestResult[10])();
  if ((length != 0) && (expected != (void *)0x0 || actual != (void *)0x0)) {
    if (expected == (void *)0x0 || actual == (void *)0x0) {
      SimpleString::SimpleString(&SStack_a8,text);
      BinaryEqualFailure::BinaryEqualFailure
                ((BinaryEqualFailure *)&local_98,this,fileName,lineNumber,(uchar *)expected,
                 (uchar *)actual,length,&SStack_a8);
      (*this->_vptr_UtestShell[0x27])(this,&local_98,testTerminator);
      TestFailure::~TestFailure(&local_98);
      SimpleString::~SimpleString(&SStack_a8);
    }
    iVar1 = SimpleString::MemCmp(expected,actual,length);
    if (iVar1 != 0) {
      SimpleString::SimpleString(&SStack_a8,text);
      BinaryEqualFailure::BinaryEqualFailure
                ((BinaryEqualFailure *)&local_98,this,fileName,lineNumber,(uchar *)expected,
                 (uchar *)actual,length,&SStack_a8);
      (*this->_vptr_UtestShell[0x27])(this,&local_98,testTerminator);
      TestFailure::~TestFailure(&local_98);
      SimpleString::~SimpleString(&SStack_a8);
    }
  }
  return;
}

Assistant:

void UtestShell::assertBinaryEqual(const void *expected, const void *actual, size_t length, const char* text, const char *fileName, size_t lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
	if (length == 0) return;
    if (actual == NULLPTR && expected == NULLPTR) return;
    if (actual == NULLPTR || expected == NULLPTR)
        failWith(BinaryEqualFailure(this, fileName, lineNumber, (const unsigned char *) expected, (const unsigned char *) actual, length, text), testTerminator);
    if (SimpleString::MemCmp(expected, actual, length) != 0)
        failWith(BinaryEqualFailure(this, fileName, lineNumber, (const unsigned char *) expected, (const unsigned char *) actual, length, text), testTerminator);
}